

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char> __thiscall
fmt::v7::detail::write<char,char,fmt::v7::detail::buffer_appender<char>>
          (detail *this,buffer_appender<char> out,basic_string_view<char> s,
          basic_format_specs<char> *specs)

{
  char *pcVar1;
  size_t width;
  buffer_appender<char> bVar2;
  basic_format_specs<char> *specs_00;
  char *pcVar3;
  char *size;
  basic_string_view<char> s_00;
  anon_class_16_2_3f014a30 local_30;
  
  specs_00 = (basic_format_specs<char> *)s.size_;
  pcVar3 = s.data_;
  pcVar1 = (char *)(long)specs_00->precision;
  size = pcVar3;
  if (pcVar1 < pcVar3) {
    size = pcVar1;
  }
  if ((long)pcVar1 < 0) {
    size = pcVar3;
  }
  if (specs_00->width == 0) {
    width = 0;
  }
  else {
    s_00.size_ = (size_t)size;
    s_00.data_ = (char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    width = count_code_points(s_00);
  }
  local_30.data = (char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  local_30.size = (size_t)size;
  bVar2 = write_padded<(fmt::v7::align::type)1,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write<char,char,fmt::v7::detail::buffer_appender<char>>(fmt::v7::detail::buffer_appender<char>,fmt::v7::basic_string_view<char>,fmt::v7::basic_format_specs<char>const&)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                    ((buffer_appender<char>)this,specs_00,(size_t)size,width,&local_30);
  return (buffer_appender<char>)
         bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

OutputIt write(OutputIt out, basic_string_view<StrChar> s,
               const basic_format_specs<Char>& specs) {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  auto width = specs.width != 0
                   ? count_code_points(basic_string_view<StrChar>(data, size))
                   : 0;
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, width, [=](iterator it) {
    return copy_str<Char>(data, data + size, it);
  });
}